

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

void __thiscall
Gudhi::Simplex_tree<Low_options>::root_members_recursive_deletion(Simplex_tree<Low_options> *this)

{
  bool bVar1;
  pointer ppVar2;
  Siblings *sib;
  Dictionary *this_00;
  vec_iterator<std::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_*,_false>
  local_28;
  undefined1 local_20 [16];
  iterator sh;
  Simplex_tree<Low_options> *this_local;
  
  sh.m_ptr = (pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>
              *)this;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Low_options>,_boost::container::flat_map<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>,_std::less<unsigned_char>,_void>_>
  ::members(&this->root_);
  boost::container::
  flat_map<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>,_std::less<unsigned_char>,_void>
  ::begin((flat_map<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>,_std::less<unsigned_char>,_void>
           *)(local_20 + 8));
  while( true ) {
    Simplex_tree_siblings<Gudhi::Simplex_tree<Low_options>,_boost::container::flat_map<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>,_std::less<unsigned_char>,_void>_>
    ::members(&this->root_);
    boost::container::
    flat_map<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>,_std::less<unsigned_char>,_void>
    ::end((flat_map<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>,_std::less<unsigned_char>,_void>
           *)local_20);
    bVar1 = boost::container::operator!=
                      ((vec_iterator<std::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_*,_false>
                        *)(local_20 + 8),
                       (vec_iterator<std::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_*,_false>
                        *)local_20);
    if (!bVar1) break;
    boost::container::
    vec_iterator<std::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_*,_false>
    ::vec_iterator(&local_28,
                   (vec_iterator<std::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_*,_false>
                    *)(local_20 + 8));
    bVar1 = has_children<boost::container::vec_iterator<std::pair<unsigned_char,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>>>*,false>>
                      (this,&local_28);
    if (bVar1) {
      ppVar2 = boost::container::
               vec_iterator<std::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_*,_false>
               ::operator->((vec_iterator<std::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_*,_false>
                             *)(local_20 + 8));
      sib = Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>::children
                      (&ppVar2->second);
      rec_delete(this,sib);
    }
    boost::container::
    vec_iterator<std::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_*,_false>
    ::operator++((vec_iterator<std::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_*,_false>
                  *)(local_20 + 8));
  }
  this_00 = Simplex_tree_siblings<Gudhi::Simplex_tree<Low_options>,_boost::container::flat_map<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>,_std::less<unsigned_char>,_void>_>
            ::members(&this->root_);
  boost::container::
  flat_map<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>,_std::less<unsigned_char>,_void>
  ::clear(this_00);
  return;
}

Assistant:

void root_members_recursive_deletion() {
    for (auto sh = root_.members().begin(); sh != root_.members().end(); ++sh) {
      if (has_children(sh)) {
        rec_delete(sh->second.children());
      }
    }
    root_.members().clear();
  }